

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

shared_ptr<nigel::IM_Command> __thiscall
nigel::IMC_Generator::generateCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Command> sVar2;
  shared_ptr<nigel::IM_Operator> *rOp_local;
  shared_ptr<nigel::IM_Operator> *lOp_local;
  HexOp operation_local;
  shared_ptr<nigel::IM_Command> *cmd;
  
  std::make_shared<nigel::IM_Command>();
  peVar1 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<nigel::IM_Operator>::operator=(&peVar1->op1,lOp);
  peVar1 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<nigel::IM_Operator>::operator=(&peVar1->op2,rOp);
  peVar1 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar1->operation = operation;
  sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::IM_Command>)
         sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IM_Command> IMC_Generator::generateCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		auto cmd = std::make_shared<IM_Command>();
		cmd->op1 = lOp;
		cmd->op2 = rOp;
		cmd->operation = operation;
		return cmd;
	}